

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O0

void * rw::destroyHAnim(void *object,int32 offset,int32 param_3)

{
  undefined4 *puVar1;
  HAnimData *hanim;
  int i;
  int32 param_2_local;
  int32 offset_local;
  void *object_local;
  
  puVar1 = (undefined4 *)((long)object + (long)offset);
  if (*(long *)(puVar1 + 2) != 0) {
    for (hanim._4_4_ = 0; hanim._4_4_ < *(int *)(*(long *)(puVar1 + 2) + 4);
        hanim._4_4_ = hanim._4_4_ + 1) {
      *(undefined8 *)(*(long *)(*(long *)(puVar1 + 2) + 0x18) + (long)hanim._4_4_ * 0x18 + 0x10) = 0
      ;
    }
    if (object == *(void **)(*(long *)(puVar1 + 2) + 0x20)) {
      HAnimHierarchy::destroy(*(HAnimHierarchy **)(puVar1 + 2));
    }
  }
  *puVar1 = 0xffffffff;
  *(undefined8 *)(puVar1 + 2) = 0;
  return object;
}

Assistant:

static void*
destroyHAnim(void *object, int32 offset, int32)
{
	int i;
	HAnimData *hanim = PLUGINOFFSET(HAnimData, object, offset);
	if(hanim->hierarchy){
		for(i = 0; i < hanim->hierarchy->numNodes; i++)
			hanim->hierarchy->nodeInfo[i].frame = nil;
		if(object == hanim->hierarchy->parentFrame)
			hanim->hierarchy->destroy();
	}
	hanim->id = -1;
	hanim->hierarchy = nil;
	return object;
}